

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O1

void __thiscall ki::protocol::dml::MessageHeader::read_from(MessageHeader *this,istream *istream)

{
  Field<unsigned_char> *pFVar1;
  Field<unsigned_char> *pFVar2;
  Field<unsigned_short> *pFVar3;
  Record record;
  ostringstream oss;
  string local_278;
  string local_258;
  string local_238 [2];
  Record local_1f8 [5];
  
  ki::dml::Record::Record(local_1f8);
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"m_service_id","");
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(local_1f8,local_238,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"m_type","");
  pFVar2 = ki::dml::Record::add_field<unsigned_char>(local_1f8,&local_258,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"m_size","");
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(local_1f8,&local_278,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  ki::dml::Record::read_from(local_1f8,istream);
  this->m_service_id = pFVar1->m_value;
  this->m_type = pFVar2->m_value;
  this->m_size = (short)*(undefined4 *)&pFVar3->m_value - 4;
  ki::dml::Record::~Record(local_1f8);
  return;
}

Assistant:

void MessageHeader::read_from(std::istream& istream)
	{
		ki::dml::Record record;
		const auto *service_id = record.add_field<ki::dml::UBYT>("m_service_id");
		const auto *type = record.add_field<ki::dml::UBYT>("m_type");
		const auto size = record.add_field<ki::dml::USHRT>("m_size");

		try
		{
			record.read_from(istream);
		}
		catch (ki::dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading MessageHeader: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_HEADER_DATA);
		}

		m_service_id = service_id->get_value();
		m_type = type->get_value();
		m_size = size->get_value() - 4;
	}